

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorProto::MergePartialFromCodedStream
          (DescriptorProto *this,CodedInputStream *input)

{
  int *piVar1;
  uint8 uVar2;
  int iVar3;
  int iVar4;
  void **ppvVar5;
  bool bVar6;
  Limit LVar7;
  string *psVar8;
  DescriptorProto *this_00;
  EnumDescriptorProto *this_01;
  DescriptorProto_ExtensionRange *this_02;
  uint8 *puVar9;
  FieldDescriptorProto *pFVar10;
  MessageOptions *pMVar11;
  uint32 tag;
  uint32 local_64;
  RepeatedPtrFieldBase *local_60;
  RepeatedPtrFieldBase *local_58;
  RepeatedPtrFieldBase *local_50;
  RepeatedPtrFieldBase *local_48;
  RepeatedPtrFieldBase *local_40;
  UnknownFieldSet *local_38;
  
  local_60 = &(this->field_).super_RepeatedPtrFieldBase;
  local_58 = &(this->nested_type_).super_RepeatedPtrFieldBase;
  local_50 = &(this->enum_type_).super_RepeatedPtrFieldBase;
  local_48 = &(this->extension_range_).super_RepeatedPtrFieldBase;
  local_40 = &(this->extension_).super_RepeatedPtrFieldBase;
  local_38 = &this->_unknown_fields_;
LAB_001e8b55:
  do {
    puVar9 = input->buffer_;
    if ((puVar9 < input->buffer_end_) && (tag = (uint32)(char)*puVar9, -1 < (char)*puVar9)) {
      input->last_tag_ = tag;
      input->buffer_ = puVar9 + 1;
    }
    else {
      tag = io::CodedInputStream::ReadTagFallback(input);
      input->last_tag_ = tag;
    }
    if (tag == 0) {
      return true;
    }
    switch(tag >> 3) {
    case 1:
      if ((tag & 7) == 2) {
        *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
        if (this->name_ == (string *)internal::kEmptyString_abi_cxx11_) {
          psVar8 = (string *)operator_new(0x20);
          (psVar8->_M_dataplus)._M_p = (pointer)&psVar8->field_2;
          psVar8->_M_string_length = 0;
          (psVar8->field_2)._M_local_buf[0] = '\0';
          this->name_ = psVar8;
        }
        bVar6 = internal::WireFormatLite::ReadString(input,this->name_);
        if (!bVar6) {
          return false;
        }
        internal::WireFormat::VerifyUTF8StringFallback
                  ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,PARSE);
        puVar9 = input->buffer_;
        if ((puVar9 < input->buffer_end_) && (*puVar9 == '\x12')) {
          do {
            input->buffer_ = puVar9 + 1;
LAB_001e8caa:
            iVar4 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
            iVar3 = (this->field_).super_RepeatedPtrFieldBase.allocated_size_;
            if (iVar4 < iVar3) {
              ppvVar5 = (this->field_).super_RepeatedPtrFieldBase.elements_;
              (this->field_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
              pFVar10 = (FieldDescriptorProto *)ppvVar5[iVar4];
            }
            else {
              iVar4 = (this->field_).super_RepeatedPtrFieldBase.total_size_;
              if (iVar3 == iVar4) {
                internal::RepeatedPtrFieldBase::Reserve(local_60,iVar4 + 1);
              }
              piVar1 = &(this->field_).super_RepeatedPtrFieldBase.allocated_size_;
              *piVar1 = *piVar1 + 1;
              pFVar10 = internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>::New();
              ppvVar5 = (this->field_).super_RepeatedPtrFieldBase.elements_;
              iVar4 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
              (this->field_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
              ppvVar5[iVar4] = pFVar10;
            }
            puVar9 = input->buffer_;
            if ((puVar9 < input->buffer_end_) && (uVar2 = *puVar9, -1 < (char)uVar2)) {
              input->buffer_ = puVar9 + 1;
              local_64 = (int)(char)uVar2;
            }
            else {
              bVar6 = io::CodedInputStream::ReadVarint32Fallback(input,&local_64);
              if (!bVar6) {
                return false;
              }
            }
            iVar4 = input->recursion_depth_;
            input->recursion_depth_ = iVar4 + 1;
            if (input->recursion_limit_ <= iVar4) {
              return false;
            }
            LVar7 = io::CodedInputStream::PushLimit(input,local_64);
            bVar6 = FieldDescriptorProto::MergePartialFromCodedStream(pFVar10,input);
            if (!bVar6) {
              return false;
            }
            if (input->legitimate_message_end_ != true) {
              return false;
            }
            io::CodedInputStream::PopLimit(input,LVar7);
            if (0 < input->recursion_depth_) {
              input->recursion_depth_ = input->recursion_depth_ + -1;
            }
            puVar9 = input->buffer_;
          } while ((puVar9 < input->buffer_end_) && (*puVar9 == '\x12'));
          puVar9 = input->buffer_;
          if ((puVar9 < input->buffer_end_) && (*puVar9 == '\x1a')) {
            do {
              input->buffer_ = puVar9 + 1;
LAB_001e8db3:
              iVar4 = (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
              iVar3 = (this->nested_type_).super_RepeatedPtrFieldBase.allocated_size_;
              if (iVar4 < iVar3) {
                ppvVar5 = (this->nested_type_).super_RepeatedPtrFieldBase.elements_;
                (this->nested_type_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
                this_00 = (DescriptorProto *)ppvVar5[iVar4];
              }
              else {
                iVar4 = (this->nested_type_).super_RepeatedPtrFieldBase.total_size_;
                if (iVar3 == iVar4) {
                  internal::RepeatedPtrFieldBase::Reserve(local_58,iVar4 + 1);
                }
                piVar1 = &(this->nested_type_).super_RepeatedPtrFieldBase.allocated_size_;
                *piVar1 = *piVar1 + 1;
                this_00 = internal::GenericTypeHandler<google::protobuf::DescriptorProto>::New();
                ppvVar5 = (this->nested_type_).super_RepeatedPtrFieldBase.elements_;
                iVar4 = (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
                (this->nested_type_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
                ppvVar5[iVar4] = this_00;
              }
              puVar9 = input->buffer_;
              if ((puVar9 < input->buffer_end_) && (uVar2 = *puVar9, -1 < (char)uVar2)) {
                input->buffer_ = puVar9 + 1;
                local_64 = (int)(char)uVar2;
              }
              else {
                bVar6 = io::CodedInputStream::ReadVarint32Fallback(input,&local_64);
                if (!bVar6) {
                  return false;
                }
              }
              iVar4 = input->recursion_depth_;
              input->recursion_depth_ = iVar4 + 1;
              if (input->recursion_limit_ <= iVar4) {
                return false;
              }
              LVar7 = io::CodedInputStream::PushLimit(input,local_64);
              bVar6 = MergePartialFromCodedStream(this_00,input);
              if (!bVar6) {
                return false;
              }
              if (input->legitimate_message_end_ != true) {
                return false;
              }
              io::CodedInputStream::PopLimit(input,LVar7);
              if (0 < input->recursion_depth_) {
                input->recursion_depth_ = input->recursion_depth_ + -1;
              }
              puVar9 = input->buffer_;
            } while ((puVar9 < input->buffer_end_) && (*puVar9 == '\x1a'));
            puVar9 = input->buffer_;
            if ((puVar9 < input->buffer_end_) && (*puVar9 == '\"')) {
              do {
                input->buffer_ = puVar9 + 1;
LAB_001e8ebc:
                iVar4 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
                iVar3 = (this->enum_type_).super_RepeatedPtrFieldBase.allocated_size_;
                if (iVar4 < iVar3) {
                  ppvVar5 = (this->enum_type_).super_RepeatedPtrFieldBase.elements_;
                  (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
                  this_01 = (EnumDescriptorProto *)ppvVar5[iVar4];
                }
                else {
                  iVar4 = (this->enum_type_).super_RepeatedPtrFieldBase.total_size_;
                  if (iVar3 == iVar4) {
                    internal::RepeatedPtrFieldBase::Reserve(local_50,iVar4 + 1);
                  }
                  piVar1 = &(this->enum_type_).super_RepeatedPtrFieldBase.allocated_size_;
                  *piVar1 = *piVar1 + 1;
                  this_01 = internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>::New
                                      ();
                  ppvVar5 = (this->enum_type_).super_RepeatedPtrFieldBase.elements_;
                  iVar4 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
                  (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
                  ppvVar5[iVar4] = this_01;
                }
                puVar9 = input->buffer_;
                if ((puVar9 < input->buffer_end_) && (uVar2 = *puVar9, -1 < (char)uVar2)) {
                  input->buffer_ = puVar9 + 1;
                  local_64 = (int)(char)uVar2;
                }
                else {
                  bVar6 = io::CodedInputStream::ReadVarint32Fallback(input,&local_64);
                  if (!bVar6) {
                    return false;
                  }
                }
                iVar4 = input->recursion_depth_;
                input->recursion_depth_ = iVar4 + 1;
                if (input->recursion_limit_ <= iVar4) {
                  return false;
                }
                LVar7 = io::CodedInputStream::PushLimit(input,local_64);
                bVar6 = EnumDescriptorProto::MergePartialFromCodedStream(this_01,input);
                if (!bVar6) {
                  return false;
                }
                if (input->legitimate_message_end_ != true) {
                  return false;
                }
                io::CodedInputStream::PopLimit(input,LVar7);
                if (0 < input->recursion_depth_) {
                  input->recursion_depth_ = input->recursion_depth_ + -1;
                }
                puVar9 = input->buffer_;
              } while ((puVar9 < input->buffer_end_) && (*puVar9 == '\"'));
              puVar9 = input->buffer_;
              if ((puVar9 < input->buffer_end_) && (*puVar9 == '*')) {
                do {
                  input->buffer_ = puVar9 + 1;
LAB_001e8fc5:
                  iVar4 = (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
                  iVar3 = (this->extension_range_).super_RepeatedPtrFieldBase.allocated_size_;
                  if (iVar4 < iVar3) {
                    ppvVar5 = (this->extension_range_).super_RepeatedPtrFieldBase.elements_;
                    (this->extension_range_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
                    this_02 = (DescriptorProto_ExtensionRange *)ppvVar5[iVar4];
                  }
                  else {
                    iVar4 = (this->extension_range_).super_RepeatedPtrFieldBase.total_size_;
                    if (iVar3 == iVar4) {
                      internal::RepeatedPtrFieldBase::Reserve(local_48,iVar4 + 1);
                    }
                    piVar1 = &(this->extension_range_).super_RepeatedPtrFieldBase.allocated_size_;
                    *piVar1 = *piVar1 + 1;
                    this_02 = internal::
                              GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>::
                              New();
                    ppvVar5 = (this->extension_range_).super_RepeatedPtrFieldBase.elements_;
                    iVar4 = (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
                    (this->extension_range_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
                    ppvVar5[iVar4] = this_02;
                  }
                  puVar9 = input->buffer_;
                  if ((puVar9 < input->buffer_end_) && (uVar2 = *puVar9, -1 < (char)uVar2)) {
                    input->buffer_ = puVar9 + 1;
                    local_64 = (int)(char)uVar2;
                  }
                  else {
                    bVar6 = io::CodedInputStream::ReadVarint32Fallback(input,&local_64);
                    if (!bVar6) {
                      return false;
                    }
                  }
                  iVar4 = input->recursion_depth_;
                  input->recursion_depth_ = iVar4 + 1;
                  if (input->recursion_limit_ <= iVar4) {
                    return false;
                  }
                  LVar7 = io::CodedInputStream::PushLimit(input,local_64);
                  bVar6 = DescriptorProto_ExtensionRange::MergePartialFromCodedStream(this_02,input)
                  ;
                  if (!bVar6) {
                    return false;
                  }
                  if (input->legitimate_message_end_ != true) {
                    return false;
                  }
                  io::CodedInputStream::PopLimit(input,LVar7);
                  if (0 < input->recursion_depth_) {
                    input->recursion_depth_ = input->recursion_depth_ + -1;
                  }
                  puVar9 = input->buffer_;
                } while ((puVar9 < input->buffer_end_) && (*puVar9 == '*'));
                puVar9 = input->buffer_;
                if ((puVar9 < input->buffer_end_) && (*puVar9 == '2')) {
                  do {
                    input->buffer_ = puVar9 + 1;
LAB_001e90e3:
                    iVar4 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
                    iVar3 = (this->extension_).super_RepeatedPtrFieldBase.allocated_size_;
                    if (iVar4 < iVar3) {
                      ppvVar5 = (this->extension_).super_RepeatedPtrFieldBase.elements_;
                      (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
                      pFVar10 = (FieldDescriptorProto *)ppvVar5[iVar4];
                    }
                    else {
                      iVar4 = (this->extension_).super_RepeatedPtrFieldBase.total_size_;
                      if (iVar3 == iVar4) {
                        internal::RepeatedPtrFieldBase::Reserve(local_40,iVar4 + 1);
                      }
                      piVar1 = &(this->extension_).super_RepeatedPtrFieldBase.allocated_size_;
                      *piVar1 = *piVar1 + 1;
                      pFVar10 = internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>
                                ::New();
                      ppvVar5 = (this->extension_).super_RepeatedPtrFieldBase.elements_;
                      iVar4 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
                      (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
                      ppvVar5[iVar4] = pFVar10;
                    }
                    puVar9 = input->buffer_;
                    if ((puVar9 < input->buffer_end_) && (uVar2 = *puVar9, -1 < (char)uVar2)) {
                      input->buffer_ = puVar9 + 1;
                      local_64 = (int)(char)uVar2;
                    }
                    else {
                      bVar6 = io::CodedInputStream::ReadVarint32Fallback(input,&local_64);
                      if (!bVar6) {
                        return false;
                      }
                    }
                    iVar4 = input->recursion_depth_;
                    input->recursion_depth_ = iVar4 + 1;
                    if (input->recursion_limit_ <= iVar4) {
                      return false;
                    }
                    LVar7 = io::CodedInputStream::PushLimit(input,local_64);
                    bVar6 = FieldDescriptorProto::MergePartialFromCodedStream(pFVar10,input);
                    if (!bVar6) {
                      return false;
                    }
                    if (input->legitimate_message_end_ != true) {
                      return false;
                    }
                    io::CodedInputStream::PopLimit(input,LVar7);
                    if (0 < input->recursion_depth_) {
                      input->recursion_depth_ = input->recursion_depth_ + -1;
                    }
                    puVar9 = input->buffer_;
                  } while ((puVar9 < input->buffer_end_) && (*puVar9 == '2'));
                  puVar9 = input->buffer_;
                  if ((puVar9 < input->buffer_end_) && (*puVar9 == ':')) {
                    input->buffer_ = puVar9 + 1;
LAB_001e91ec:
                    *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x40;
                    if (this->options_ == (MessageOptions *)0x0) {
                      pMVar11 = (MessageOptions *)operator_new(0x68);
                      MessageOptions::MessageOptions(pMVar11);
                      this->options_ = pMVar11;
                    }
                    pMVar11 = this->options_;
                    puVar9 = input->buffer_;
                    if ((puVar9 < input->buffer_end_) && (uVar2 = *puVar9, -1 < (char)uVar2)) {
                      input->buffer_ = puVar9 + 1;
                      local_64 = (int)(char)uVar2;
                    }
                    else {
                      bVar6 = io::CodedInputStream::ReadVarint32Fallback(input,&local_64);
                      if (!bVar6) {
                        return false;
                      }
                    }
                    iVar4 = input->recursion_depth_;
                    input->recursion_depth_ = iVar4 + 1;
                    if (input->recursion_limit_ <= iVar4) {
                      return false;
                    }
                    LVar7 = io::CodedInputStream::PushLimit(input,local_64);
                    bVar6 = MessageOptions::MergePartialFromCodedStream(pMVar11,input);
                    if (!bVar6) {
                      return false;
                    }
                    if (input->legitimate_message_end_ != true) {
                      return false;
                    }
                    io::CodedInputStream::PopLimit(input,LVar7);
                    if (0 < input->recursion_depth_) {
                      input->recursion_depth_ = input->recursion_depth_ + -1;
                    }
                    if ((input->buffer_ == input->buffer_end_) &&
                       ((input->buffer_size_after_limit_ != 0 ||
                        (input->total_bytes_read_ == input->current_limit_)))) {
                      input->last_tag_ = 0;
                      input->legitimate_message_end_ = true;
                      return true;
                    }
                  }
                }
              }
            }
          }
        }
        goto LAB_001e8b55;
      }
      break;
    case 2:
      if ((tag & 7) == 2) goto LAB_001e8caa;
      break;
    case 3:
      if ((tag & 7) == 2) goto LAB_001e8db3;
      break;
    case 4:
      if ((tag & 7) == 2) goto LAB_001e8ebc;
      break;
    case 5:
      if ((tag & 7) == 2) goto LAB_001e8fc5;
      break;
    case 6:
      if ((tag & 7) == 2) goto LAB_001e90e3;
      break;
    case 7:
      if ((tag & 7) == 2) goto LAB_001e91ec;
    }
    if ((tag & 7) == 4) {
      return true;
    }
    bVar6 = internal::WireFormat::SkipField(input,tag,local_38);
    if (!bVar6) {
      return false;
    }
  } while( true );
}

Assistant:

bool DescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_field;
        break;
      }

      // repeated .google.protobuf.FieldDescriptorProto field = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_field:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_field()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_field;
        if (input->ExpectTag(26)) goto parse_nested_type;
        break;
      }

      // repeated .google.protobuf.DescriptorProto nested_type = 3;
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_nested_type:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_nested_type()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(26)) goto parse_nested_type;
        if (input->ExpectTag(34)) goto parse_enum_type;
        break;
      }

      // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
      case 4: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_enum_type:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_enum_type()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(34)) goto parse_enum_type;
        if (input->ExpectTag(42)) goto parse_extension_range;
        break;
      }

      // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
      case 5: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_extension_range:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_extension_range()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(42)) goto parse_extension_range;
        if (input->ExpectTag(50)) goto parse_extension;
        break;
      }

      // repeated .google.protobuf.FieldDescriptorProto extension = 6;
      case 6: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_extension:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_extension()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(50)) goto parse_extension;
        if (input->ExpectTag(58)) goto parse_options;
        break;
      }

      // optional .google.protobuf.MessageOptions options = 7;
      case 7: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_options:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}